

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_codecs.c
# Opt level: O3

int cram_codec_to_id(cram_codec *c,int *id2)

{
  uint uVar1;
  int iVar2;
  
  iVar2 = -2;
  uVar1 = 0xffffffff;
  switch(c->codec) {
  case E_NULL:
    uVar1 = 0xfffffffe;
    break;
  case E_EXTERNAL:
    uVar1 = (c->field_6).huffman.ncodes;
    break;
  case E_GOLOMB:
  case E_BETA:
  case E_SUBEXP:
  case E_GOLOMB_RICE:
  case E_GAMMA:
    break;
  case E_HUFFMAN:
    uVar1 = ~(uint)((c->field_6).huffman.ncodes == 1);
    break;
  case E_BYTE_ARRAY_LEN:
    uVar1 = cram_codec_to_id((c->field_6).byte_array_len.len_codec,(int *)0x0);
    iVar2 = cram_codec_to_id((c->field_6).byte_array_len.value_codec,(int *)0x0);
    break;
  case E_BYTE_ARRAY_STOP:
    uVar1 = (c->field_6).beta.nbits;
    break;
  default:
    fprintf(_stderr,"Unknown codec type %d\n");
  }
  if (id2 != (int *)0x0) {
    *id2 = iVar2;
  }
  return uVar1;
}

Assistant:

int cram_codec_to_id(cram_codec *c, int *id2) {
    int bnum1, bnum2 = -2;

    switch (c->codec) {
    case E_HUFFMAN:
	bnum1 = c->huffman.ncodes == 1 ? -2 : -1;
	break;
    case E_GOLOMB:
    case E_BETA:
    case E_SUBEXP:
    case E_GOLOMB_RICE:
    case E_GAMMA:
	bnum1 = -1;
	break;
    case E_EXTERNAL:
	bnum1 = c->external.content_id;
	break;
    case E_BYTE_ARRAY_LEN:
	bnum1 = cram_codec_to_id(c->byte_array_len.len_codec, NULL);
	bnum2 = cram_codec_to_id(c->byte_array_len.value_codec, NULL);
	break;
    case E_BYTE_ARRAY_STOP:
	bnum1 = c->byte_array_stop.content_id;
	break;
    case E_NULL:
	bnum1 = -2;
	break;
    default:
	fprintf(stderr, "Unknown codec type %d\n", c->codec);
	bnum1 = -1;
    }

    if (id2)
	*id2 = bnum2;
    return bnum1;
}